

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O0

bool __thiscall libDAI::NDP::initProps(NDP *this)

{
  bool bVar1;
  unsigned_long uVar2;
  long in_RDI;
  PropertyKey *in_stack_ffffffffffffff68;
  InferenceAlgorithm *in_stack_ffffffffffffff70;
  InferenceAlgorithm *this_00;
  allocator<char> local_69;
  string local_68 [8];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  bVar1 = InferenceAlgorithm::HasProperty(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
  if (bVar1) {
    this_00 = (InferenceAlgorithm *)&local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    uVar2 = InferenceAlgorithm::FromStringTo<unsigned_long>(this_00,in_stack_ffffffffffffff68);
    *(unsigned_long *)(in_RDI + 0x118) = uVar2;
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return bVar1;
}

Assistant:

bool NDP::initProps() {
        //if( !HasProperty("updates") )
            //return false;
        //if( !HasProperty("tol") )
            //return false;
        //if( !HasProperty("maxiter") )
            //return false;
        if( !HasProperty("verbose") )
            return false;
        
        //Props.updates = FromStringTo<UpdateType>("updates");
        //Props.tol     = FromStringTo<double>("tol");
        //Props.maxiter = FromStringTo<size_t>("maxiter");
        Props.verbose = FromStringTo<size_t>("verbose");
        //if( HasProperty("damping") )
            //Props.damping = FromStringTo<double>("damping");
        //else
            //Props.damping = 0.0;

        return true;
    }